

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<const_char_*const> init_list;
  bool bVar1;
  string *psVar2;
  id this;
  ostream *this_00;
  code *local_300;
  undefined8 local_2f8;
  thread local_2f0;
  thread t2;
  thread local_2d8;
  thread t1;
  TracerouteRunner *t;
  string url;
  char *local_118;
  char *local_110;
  iterator local_108;
  undefined8 local_100;
  undefined1 local_f8 [8];
  parser locate_route;
  char **argv_local;
  int argc_local;
  
  locate_route.empty_.field_2._8_8_ = argv;
  argh::parser::parser((parser *)local_f8,argc,argv,1);
  local_118 = "-h";
  local_110 = "--help";
  local_108 = &local_118;
  local_100 = 2;
  init_list._M_len = 2;
  init_list._M_array = local_108;
  bVar1 = argh::parser::operator[]((parser *)local_f8,init_list);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,
                    "locateroute - Get location information of the traceroute hops\n\n");
    std::operator<<((ostream *)&std::cout,"USAGE: \n\t locateroute [ip or domain name]\n");
    std::operator<<((ostream *)&std::cout,"FLAGS: \n\t -h, --help  Display Help\n");
  }
  else {
    argh::parser::operator()((string_stream *)((long)&url.field_2 + 8),(parser *)local_f8,1);
    bVar1 = argh::stringstream_proxy::operator_cast_to_bool
                      ((stringstream_proxy *)((long)&url.field_2 + 8));
    argh::stringstream_proxy::~stringstream_proxy((stringstream_proxy *)((long)&url.field_2 + 8));
    if (bVar1) {
      psVar2 = argh::parser::operator[][abi_cxx11_((parser *)local_f8,1);
      std::__cxx11::string::string((string *)&t,(string *)psVar2);
      this._M_thread = (native_handle_type)operator_new(0x68);
      TracerouteRunner::TracerouteRunner((TracerouteRunner *)this._M_thread,(string *)&t);
      t2._M_id._M_thread = (id)TracerouteRunner::fetch_results;
      t1._M_id._M_thread = (id)(id)this._M_thread;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&local_2d8,(type *)&t2,(TracerouteRunner **)&t1);
      local_300 = TracerouteRunner::print_output;
      local_2f8 = 0;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&local_2f0,(type *)&local_300,(TracerouteRunner **)&t1);
      std::thread::join();
      std::thread::join();
      std::thread::~thread(&local_2f0);
      std::thread::~thread(&local_2d8);
      std::__cxx11::string::~string((string *)&t);
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"Enter ip address or domain name");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  argh::parser::~parser((parser *)local_f8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argh::parser locate_route(argc, argv);

	if(locate_route[{"-h", "--help"}]) {
		std::cout << "locateroute - Get location information of the traceroute hops\n\n";
		std::cout << "USAGE: \n\t locateroute [ip or domain name]\n";
		std::cout << "FLAGS: \n\t -h, --help  Display Help\n";
	} else {
		if(locate_route(1)) {
			std::string url = locate_route[1];
			auto *t = new TracerouteRunner(url);

			std::thread t1(&TracerouteRunner::fetch_results, t);
			std::thread t2(&TracerouteRunner::print_output, t);

			t1.join();
			t2.join();
		} else {
			std::cout << "Enter ip address or domain name" << std::endl;
		}
	}

	return 0;
}